

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpki-rov.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  uint reason_len;
  pfx_record *reason;
  pfxv_state result;
  int asn;
  int mask;
  rtr_mgr_config *conf;
  rtr_socket rtr_tcp;
  tr_socket tr_tcp;
  char tmp [100];
  char ip [46];
  lrtr_ip_addr pref;
  char input [256];
  rtr_mgr_group groups [1];
  uint local_324;
  long local_320;
  uint local_314;
  uint local_310;
  uint local_30c;
  undefined8 local_308;
  undefined1 *local_300 [16];
  char *local_280;
  char *local_278;
  undefined8 local_270;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined8 uStack_25c;
  undefined1 local_250 [56];
  undefined1 local_218 [112];
  char local_1a8 [60];
  undefined1 local_16c [20];
  char local_158 [256];
  long *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 3) {
    printf("Usage: %s [host] [port]\n",*argv);
    iVar11 = 1;
  }
  else {
    local_280 = argv[1];
    local_278 = argv[2];
    local_270 = 0;
    uStack_268 = 0;
    uStack_264 = 0;
    uStack_260 = 0;
    uStack_25c = 0;
    tr_tcp_init(&local_280,local_250);
    local_300[0] = local_250;
    local_58 = (long *)malloc(8);
    local_50 = 1;
    *local_58 = (long)local_300;
    local_4c = 1;
    iVar11 = 1;
    iVar5 = rtr_mgr_init(&local_308,&local_58,1,connection_status_callback,0);
    if (-1 < iVar5) {
      iVar5 = rtr_mgr_add_roa_support(local_308,0);
      if (iVar5 == -1) {
        main_cold_1();
      }
      iVar5 = rtr_mgr_add_aspa_support(local_308,0);
      if (iVar5 == -1) {
        main_cold_2();
      }
      iVar5 = rtr_mgr_add_spki_support(local_308,0);
      if (iVar5 == -1) {
        main_cold_3();
      }
      rtr_mgr_setup_sockets(local_308,&local_58,1,0x32,600,600);
      rtr_mgr_start(local_308);
      iVar5 = 0x14;
      iVar11 = 1;
      do {
        cVar4 = rtr_mgr_conf_in_sync(local_308);
        if (cVar4 != '\0') {
          iVar11 = 0;
          goto LAB_0010166a;
        }
        iVar6 = connection_error(connection_status);
        if (iVar6 != 0) goto LAB_0010161e;
        sleep(1);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      fgets(local_158,0x100,_stdin);
      puts("timeout");
      fflush(_stdout);
    }
  }
  goto LAB_0010161e;
LAB_0010166a:
  do {
    iVar5 = connection_error(connection_status);
    bVar2 = true;
    if (iVar5 == 0) {
      pcVar7 = fgets(local_158,0x100,_stdin);
      if (pcVar7 == (char *)0x0) {
        puts("input error");
        goto LAB_0010167f;
      }
      sVar8 = strlen(local_158);
      iVar5 = (int)sVar8 + -1;
      lVar10 = (long)iVar5;
      if (local_158[lVar10] == '\n') {
        local_158[lVar10] = '\0';
      }
      if (iVar5 < 1) {
LAB_00101907:
        puts("Arguments required: IP Mask ASN");
        fflush(_stdout);
LAB_00101922:
        bVar2 = false;
      }
      else {
        lVar9 = 0;
        iVar5 = 0;
        do {
          if ((local_158[lVar9] == ' ') && (local_158[lVar9 + 1] != ' ')) {
            iVar5 = iVar5 + (uint)(lVar9 != 0 && local_158[lVar9 + 1] != '\0');
          }
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
        if (iVar5 != 2) goto LAB_00101907;
        pcVar7 = strtok(local_158," ");
        sVar8 = strlen(pcVar7);
        if (sVar8 < 0x2e) {
          local_1a8[0x20] = '\0';
          local_1a8[0x21] = '\0';
          local_1a8[0x22] = '\0';
          local_1a8[0x23] = '\0';
          local_1a8[0x24] = '\0';
          local_1a8[0x25] = '\0';
          local_1a8[0x26] = '\0';
          local_1a8[0x27] = '\0';
          local_1a8[0x28] = '\0';
          local_1a8[0x29] = '\0';
          local_1a8[0x2a] = '\0';
          local_1a8[0x2b] = '\0';
          local_1a8[0x2c] = '\0';
          local_1a8[0x2d] = '\0';
          local_1a8[0x10] = '\0';
          local_1a8[0x11] = '\0';
          local_1a8[0x12] = '\0';
          local_1a8[0x13] = '\0';
          local_1a8[0x14] = '\0';
          local_1a8[0x15] = '\0';
          local_1a8[0x16] = '\0';
          local_1a8[0x17] = '\0';
          local_1a8[0x18] = '\0';
          local_1a8[0x19] = '\0';
          local_1a8[0x1a] = '\0';
          local_1a8[0x1b] = '\0';
          local_1a8[0x1c] = '\0';
          local_1a8[0x1d] = '\0';
          local_1a8[0x1e] = '\0';
          local_1a8[0x1f] = '\0';
          local_1a8[0] = '\0';
          local_1a8[1] = '\0';
          local_1a8[2] = '\0';
          local_1a8[3] = '\0';
          local_1a8[4] = '\0';
          local_1a8[5] = '\0';
          local_1a8[6] = '\0';
          local_1a8[7] = '\0';
          local_1a8[8] = '\0';
          local_1a8[9] = '\0';
          local_1a8[10] = '\0';
          local_1a8[0xb] = '\0';
          local_1a8[0xc] = '\0';
          local_1a8[0xd] = '\0';
          local_1a8[0xe] = '\0';
          local_1a8[0xf] = '\0';
          strncpy(local_1a8,pcVar7,0x2d);
          iVar5 = lrtr_ip_str_to_addr(local_1a8,local_16c);
          if (iVar5 != 0) {
            main_cold_4();
            goto LAB_001018fa;
          }
          pcVar7 = strtok((char *)0x0," ");
          iVar5 = str_to_int(pcVar7,(int *)&local_30c);
          if (iVar5 == 0) {
            pcVar7 = strtok((char *)0x0," ");
            iVar5 = str_to_int(pcVar7,(int *)&local_310);
            uVar3 = local_310;
            if (iVar5 == 0) {
              local_320 = 0;
              local_324 = 0;
              uVar12 = (ulong)local_30c;
              pfx_table_validate_r
                        (*(undefined8 *)(*local_58 + 0x38),&local_320,&local_324,local_310,local_16c
                         ,uVar12 & 0xff,&local_314);
              uVar1 = local_314;
              if (2 < local_314) {
                uVar1 = 0xffffffff;
              }
              printf("%s %d %d|",local_1a8,uVar12,(ulong)uVar3);
              if ((local_320 != 0) && (local_324 != 0)) {
                lVar10 = 0x19;
                uVar12 = 0;
                do {
                  lrtr_ip_addr_to_str(local_320 + lVar10 + -0x15,local_218,100);
                  printf("%u %s %u %u",(ulong)*(uint *)(local_320 + -0x19 + lVar10),local_218,
                         (ulong)*(byte *)(local_320 + -1 + lVar10),
                         (ulong)*(byte *)(local_320 + lVar10));
                  uVar12 = uVar12 + 1;
                  if (uVar12 < local_324) {
                    putchar(0x2c);
                  }
                  lVar10 = lVar10 + 0x28;
                } while (uVar12 < local_324);
              }
              printf("|%d",(ulong)uVar1);
              putchar(10);
              fflush(_stdout);
              goto LAB_001018fa;
            }
            main_cold_6();
          }
          else {
            main_cold_5();
          }
          goto LAB_00101922;
        }
        main_cold_7();
LAB_001018fa:
        bVar2 = false;
      }
    }
    else {
LAB_0010167f:
      iVar11 = 1;
    }
  } while (!bVar2);
LAB_0010161e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

int main(int argc, char *argv[])
{
	/* check arguments, need hostname/IP and port of cache-server */
	if (argc < 3) {
		printf("Usage: %s [host] [port]\n", argv[0]);
		return EXIT_FAILURE;
	}

	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {argv[1], argv[2], NULL, NULL, NULL, 0};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_config *conf;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mgr_group array with 1 element */
	groups[0].sockets = malloc(1 * sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	if (rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL) < 0)
		return EXIT_FAILURE;

	if (rtr_mgr_add_roa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ROA support\n");
	}

	if (rtr_mgr_add_aspa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ASPA support\n");
	}

	if (rtr_mgr_add_spki_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing BGPSEC support\n");
	}

	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);

	rtr_mgr_start(conf);

	char input[256];
	int sleep_counter = 0;

	/* wait till at least one rtr_mgr_group is synchronized with server */
	while (!rtr_mgr_conf_in_sync(conf)) {
		if (connection_error(connection_status))
			return EXIT_FAILURE;

		sleep(1);
		sleep_counter++;
		if (sleep_counter >= connection_timeout) {
			/*
			 * Wait for input before printing "timeout",
			 * to avoid "broken pipee error while communicating
			 * with the Python program
			 */
			if (fgets(input, 256, stdin))
				;
			printf("timeout\n");
			fflush(stdout);
			return EXIT_FAILURE;
		}
	}

	int counter;
	/* loop for input */
	while (1) {
		int input_len;
		int spaces;

		/* recheck connection, exit on failure */
		if (connection_error(connection_status))
			return EXIT_FAILURE;

		/* try reading from stdin, exit on failure */
		if (!fgets(input, 256, stdin)) {
			printf("input error\n");
			return EXIT_FAILURE;
		}

		/* remove newline, if present */
		input_len = strlen(input) - 1;
		if (input[input_len] == '\n')
			input[input_len] = '\0';

		/* check if there are exactly 3 arguments */
		spaces = 0;
		for (counter = 0; counter < input_len; counter++) {
			if (input[counter] == ' ' && input[counter + 1] != ' ' && input[counter + 1] != '\0' &&
			    counter != 0)
				spaces++;
		}

		/* check input matching pattern */
		if (spaces != 2) {
			printf("Arguments required: IP Mask ASN\n");
			fflush(stdout);
			continue;
		}

		char delims[] = " ";
		char *input_tok = NULL;

		input_tok = strtok(input, delims);
		struct lrtr_ip_addr pref;
		char ip[INET6_ADDRSTRLEN];

		if (strlen(input_tok) > sizeof(ip) - 1) {
			fprintf(stderr, "Error: Invalid ip addr\n");
			continue;
		}

		memset(ip, 0, sizeof(ip));
		strncpy(ip, input_tok, sizeof(ip) - 1);

		if (lrtr_ip_str_to_addr(ip, &pref) != 0) {
			fprintf(stderr, "Error: Invalid ip addr\n");
			continue;
		}

		input_tok = strtok(NULL, delims);
		int mask;

		if (str_to_int(input_tok, &mask)) {
			fprintf(stderr, "Error: Invalid mask\n");
			continue;
		}

		input_tok = strtok(NULL, delims);
		int asn;

		if (str_to_int(input_tok, &asn)) {
			fprintf(stderr, "Error: Invalid asn\n");
			continue;
		}

		enum pfxv_state result;
		struct pfx_record *reason = NULL;
		unsigned int reason_len = 0;

		/* do validation */
		pfx_table_validate_r(groups[0].sockets[0]->pfx_table, &reason, &reason_len, asn, &pref, mask, &result);

		int validity_code = -1;
		/* translate validation result */
		if (result == BGP_PFXV_STATE_VALID)
			validity_code = 0;
		else if (result == BGP_PFXV_STATE_NOT_FOUND)
			validity_code = 1;
		else if (result == BGP_PFXV_STATE_INVALID)
			validity_code = 2;

		/* IP Mask BGP-ASN| */
		printf("%s %d %d|", ip, mask, asn);

		/* ROA-ASN IP MaskMin MaskMax, ... */
		if (reason && (reason_len > 0)) {
			unsigned int i;

			for (i = 0; i < reason_len; i++) {
				char tmp[100];

				lrtr_ip_addr_to_str(&reason[i].prefix, tmp, sizeof(tmp));
				printf("%u %s %u %u", reason[i].asn, tmp, reason[i].min_len, reason[i].max_len);
				if ((i + 1) < reason_len)
					printf(",");
			}
		}

		/* |validity_code */
		printf("|%d", validity_code);

		printf("\n");
		fflush(stdout);
	}

	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);
	free(groups[0].sockets);

	return EXIT_SUCCESS;
}